

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O2

void __thiscall
cinject::ComponentBuilderBase<IWalker,IRunner,IJumper,IFlyer,IWaterConsumer,Bird>::
addRegistration<Bird,cinject::InstanceStorage<Bird,cinject::ConstructorFactory<Bird,void>>,IWalker>
          (ComponentBuilderBase<IWalker,IRunner,IJumper,IFlyer,IWaterConsumer,Bird> *this,
          shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
          *instanceStorage)

{
  long lVar1;
  vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>
  *this_00;
  CastInstanceRetriever<Bird,_IWalker,_cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
  *this_01;
  allocator local_89;
  shared_ptr<cinject::IInstanceRetriever> local_88;
  __shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  local_78;
  undefined1 local_68 [40];
  string local_40;
  
  lVar1 = *(long *)this;
  std::__cxx11::string::string((string *)&local_40,"",&local_89);
  make_component_type<IWalker>((component_type *)local_68,&local_40);
  this_00 = (vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>
             *)std::__detail::
               _Map_base<cinject::component_type,_std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cinject::component_type>,_cinject::component_type_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<cinject::component_type,_std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>,_std::allocator<std::pair<const_cinject::component_type,_std::vector<std::shared_ptr<cinject::IInstanceRetriever>,_std::allocator<std::shared_ptr<cinject::IInstanceRetriever>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cinject::component_type>,_cinject::component_type_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(lVar1 + 8),(key_type *)local_68);
  this_01 = (CastInstanceRetriever<Bird,_IWalker,_cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
             *)operator_new(0x18);
  std::
  __shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_78,
                 &instanceStorage->
                  super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  CastInstanceRetriever<Bird,_IWalker,_cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
  ::CastInstanceRetriever
            (this_01,(shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
                      *)&local_78);
  std::__shared_ptr<cinject::IInstanceRetriever,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cinject::CastInstanceRetriever<Bird,IWalker,cinject::InstanceStorage<Bird,cinject::ConstructorFactory<Bird,void>>>,void>
            ((__shared_ptr<cinject::IInstanceRetriever,(__gnu_cxx::_Lock_policy)2> *)&local_88,
             this_01);
  std::
  vector<std::shared_ptr<cinject::IInstanceRetriever>,std::allocator<std::shared_ptr<cinject::IInstanceRetriever>>>
  ::emplace_back<std::shared_ptr<cinject::IInstanceRetriever>>(this_00,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<cinject::IInstanceRetriever,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  std::__cxx11::string::~string((string *)(local_68 + 8));
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void addRegistration(std::shared_ptr<TInstanceStorage> instanceStorage)
    {
        static_assert(std::is_convertible<TImplementation*, TComponent*>::value, "No conversion exists from TImplementation* to TComponent*");

        container_->registrations_[make_component_type<TComponent>()]
            .emplace_back(std::shared_ptr<IInstanceRetriever>(new CastInstanceRetriever<TImplementation, TComponent, TInstanceStorage>(instanceStorage)));
    }